

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

uint32_t __thiscall
front::syntax::SyntaxAnalyze::gm_const_init_val
          (SyntaxAnalyze *this,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *init_values,
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *dimensions,uint32_t braceLayerNum)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  element_type *peVar5;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *this_00;
  uint in_ECX;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *in_RDX;
  SyntaxAnalyze *in_RSI;
  SharedExNdPtr value_1;
  SharedExNdPtr value;
  int i;
  uint32_t nowValueNum;
  uint32_t totalValueNum;
  Token in_stack_000000bc;
  SyntaxAnalyze *in_stack_000000c0;
  SyntaxAnalyze *in_stack_ffffffffffffff48;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *in_stack_ffffffffffffff50;
  value_type *in_stack_ffffffffffffff58;
  value_type *__x;
  SyntaxAnalyze *in_stack_ffffffffffffff60;
  undefined1 *in_stack_ffffffffffffff68;
  SyntaxAnalyze *in_stack_ffffffffffffff70;
  undefined1 local_78 [32];
  int local_58;
  undefined1 local_48 [16];
  uint local_28;
  uint braceLayerNum_00;
  uint uVar6;
  
  uVar6 = 1;
  for (local_28 = in_ECX; uVar3 = (ulong)(int)local_28,
      sVar4 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::size(in_RDX), uVar3 < sVar4; local_28 = local_28 + 1) {
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::at(in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a3160);
    uVar6 = peVar5->_value * uVar6;
  }
  braceLayerNum_00 = 0;
  while (bVar1 = try_word(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                          (Token)in_stack_ffffffffffffff68,
                          (Token)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (Token)in_stack_ffffffffffffff60), ((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = try_word(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (Token)in_stack_ffffffffffffff58);
    if (bVar1) {
      match_one_word(in_stack_000000c0,in_stack_000000bc);
      uVar2 = gm_const_init_val(in_RSI,in_RDX,
                                (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                 *)CONCAT44(in_ECX,uVar6),braceLayerNum_00);
      braceLayerNum_00 = uVar2 + braceLayerNum_00;
      match_one_word(in_stack_000000c0,in_stack_000000bc);
    }
    else {
      braceLayerNum_00 = braceLayerNum_00 + 1;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a3246);
      gm_const_exp(in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff70 = (SyntaxAnalyze *)&stack0xffffffffffffffc8;
      in_stack_ffffffffffffff68 = local_48;
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_ffffffffffffff50,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_ffffffffffffff48);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a327d);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      sVar4 = std::
              vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
              ::size(in_RDX);
      if (sVar4 == 0) {
        local_58 = 6;
      }
      else {
        local_58 = 0;
      }
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a32e3);
      if (local_58 != 0) break;
    }
    bVar1 = try_word(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                     (Token)in_stack_ffffffffffffff58);
    if (bVar1) {
      match_one_word(in_stack_000000c0,in_stack_000000bc);
    }
  }
  for (; braceLayerNum_00 < uVar6; braceLayerNum_00 = braceLayerNum_00 + 1) {
    std::shared_ptr<front::express::ExpressNode>::shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a333f);
    this_00 = (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               *)operator_new(0x48);
    express::ExpressNode::ExpressNode((ExpressNode *)in_stack_ffffffffffffff70);
    std::shared_ptr<front::express::ExpressNode>::shared_ptr<front::express::ExpressNode,void>
              ((shared_ptr<front::express::ExpressNode> *)in_stack_ffffffffffffff50,
               (ExpressNode *)in_stack_ffffffffffffff48);
    __x = (value_type *)(local_78 + 0x10);
    in_stack_ffffffffffffff50 =
         (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          *)local_78;
    std::shared_ptr<front::express::ExpressNode>::operator=
              ((shared_ptr<front::express::ExpressNode> *)in_stack_ffffffffffffff50,
               (shared_ptr<front::express::ExpressNode> *)in_stack_ffffffffffffff48);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a3390);
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a339a);
    peVar5->_type = CNS;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a33aa);
    peVar5->_operation = NUMBER;
    peVar5 = std::
             __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2a33bb);
    peVar5->_value = 0;
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::push_back(this_00,__x);
    std::shared_ptr<front::express::ExpressNode>::~shared_ptr
              ((shared_ptr<front::express::ExpressNode> *)0x2a33e0);
  }
  return braceLayerNum_00;
}

Assistant:

uint32_t SyntaxAnalyze::gm_const_init_val(vector<SharedExNdPtr> &init_values,
                                          vector<SharedExNdPtr> &dimensions,
                                          uint32_t braceLayerNum) {
  uint32_t totalValueNum;
  uint32_t nowValueNum;

  totalValueNum = 1;
  for (int i = braceLayerNum; i < dimensions.size(); i++) {
    totalValueNum *= dimensions.at(i)->_value;
  }
  nowValueNum = 0;

  while (!try_word(1, Token::RBRACE, Token::COMMA, Token::SEMICN)) {
    if (try_word(1, Token::LBRACE)) {
      match_one_word(Token::LBRACE);

      nowValueNum +=
          gm_const_init_val(init_values, dimensions, braceLayerNum + 1);

      match_one_word(Token::RBRACE);
    } else {
      nowValueNum++;
      SharedExNdPtr value;
      value = gm_const_exp();
      init_values.push_back(value);
      if (dimensions.size() == 0) {
        break;
      }
    }
    if (try_word(1, Token::COMMA)) {
      match_one_word(Token::COMMA);
    }
  }

  for (; nowValueNum < totalValueNum; nowValueNum++) {
    SharedExNdPtr value;
    value = SharedExNdPtr(new ExpressNode());
    value->_type = NodeType::CNS;
    value->_operation = OperationType::NUMBER;
    value->_value = 0;
    init_values.push_back(value);
  }

  return nowValueNum;
}